

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

int debug_putchunkname(SBuf *sb,GCproto *pt,int pathstrip)

{
  long lVar1;
  char cVar2;
  MSize len;
  int iVar3;
  long lVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  GCstr *s;
  
  s = (GCstr *)(ulong)(pt->chunkname).gcptr32;
  if (pt->firstline == -1) {
    lj_buf_putmem(sb,"[builtin:",9);
    lj_buf_putstr(sb,s);
    uVar6 = (sb->p).ptr32;
    pcVar5 = (char *)(ulong)uVar6;
    if ((sb->e).ptr32 == uVar6) {
      pcVar5 = lj_buf_more2(sb,1);
    }
    *pcVar5 = ']';
    (sb->p).ptr32 = (int)pcVar5 + 1;
    iVar3 = 0;
  }
  else {
    cVar2 = (char)s[1].nextgc.gcptr32;
    if ((cVar2 == '@') || (cVar2 == '=')) {
      len = s->len - 1;
      pcVar5 = (char *)((long)&s[1].nextgc.gcptr32 + 1);
      if ((pathstrip != 0) && (uVar6 = s->len - 2, -1 < (int)uVar6)) {
        pcVar7 = (char *)((long)&s[1].nextgc.gcptr32 + (ulong)uVar6 + 2);
        lVar4 = 0;
        do {
          if ((pcVar7[-1] == '\\') || (pcVar7[-1] == '/')) {
            len = -(int)lVar4;
            pcVar5 = pcVar7;
            break;
          }
          pcVar7 = pcVar7 + -1;
          lVar1 = (ulong)uVar6 + 1 + lVar4;
          lVar4 = lVar4 + -1;
        } while (lVar1 != 1 && -1 < lVar1 + -1);
      }
    }
    else {
      len = 8;
      pcVar5 = "[string]";
    }
    lj_buf_putmem(sb,pcVar5,len);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int debug_putchunkname(SBuf *sb, GCproto *pt, int pathstrip)
{
  GCstr *name = proto_chunkname(pt);
  const char *p = strdata(name);
  if (pt->firstline == ~(BCLine)0) {
    lj_buf_putmem(sb, "[builtin:", 9);
    lj_buf_putstr(sb, name);
    lj_buf_putb(sb, ']');
    return 0;
  }
  if (*p == '=' || *p == '@') {
    MSize len = name->len-1;
    p++;
    if (pathstrip) {
      int i;
      for (i = len-1; i >= 0; i--)
	if (p[i] == '/' || p[i] == '\\') {
	  len -= i+1;
	  p = p+i+1;
	  break;
	}
    }
    lj_buf_putmem(sb, p, len);
  } else {
    lj_buf_putmem(sb, "[string]", 8);
  }
  return 1;
}